

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

size_t ZSTD_count_2segments(BYTE *ip,BYTE *match,BYTE *iEnd,BYTE *mEnd,BYTE *iStart)

{
  size_t sVar1;
  BYTE *local_50;
  size_t matchLength;
  BYTE *vEnd;
  BYTE *iStart_local;
  BYTE *mEnd_local;
  BYTE *iEnd_local;
  BYTE *match_local;
  BYTE *ip_local;
  
  local_50 = iEnd;
  if (ip + ((long)mEnd - (long)match) < iEnd) {
    local_50 = ip + ((long)mEnd - (long)match);
  }
  ip_local = (BYTE *)ZSTD_count(ip,match,local_50);
  if (match + (long)ip_local == mEnd) {
    sVar1 = ZSTD_count(ip + (long)ip_local,iStart,iEnd);
    ip_local = ip_local + sVar1;
  }
  return (size_t)ip_local;
}

Assistant:

MEM_STATIC size_t
ZSTD_count_2segments(const BYTE* ip, const BYTE* match,
                     const BYTE* iEnd, const BYTE* mEnd, const BYTE* iStart)
{
    const BYTE* const vEnd = MIN( ip + (mEnd - match), iEnd);
    size_t const matchLength = ZSTD_count(ip, match, vEnd);
    if (match + matchLength != mEnd) return matchLength;
    DEBUGLOG(7, "ZSTD_count_2segments: found a 2-parts match (current length==%zu)", matchLength);
    DEBUGLOG(7, "distance from match beginning to end dictionary = %zi", mEnd - match);
    DEBUGLOG(7, "distance from current pos to end buffer = %zi", iEnd - ip);
    DEBUGLOG(7, "next byte : ip==%02X, istart==%02X", ip[matchLength], *iStart);
    DEBUGLOG(7, "final match length = %zu", matchLength + ZSTD_count(ip+matchLength, iStart, iEnd));
    return matchLength + ZSTD_count(ip+matchLength, iStart, iEnd);
}